

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev-lang-demo.cpp
# Opt level: O0

void motor_action(servo_motor *m)

{
  int iVar1;
  ostream *poVar2;
  void *pvVar3;
  ostream *poVar4;
  ostream *poVar5;
  string new_mode;
  int new_value;
  char c;
  ostream *in_stack_fffffffffffffe30;
  ostream *in_stack_fffffffffffffe38;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [48];
  string local_30 [32];
  int local_10;
  char local_9 [9];
  
  local_9[0] = '\0';
  local_10 = 0;
  std::__cxx11::string::string(local_30);
  do {
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"*** servo motor (");
    ev3dev::servo_motor::address_abi_cxx11_((servo_motor *)in_stack_fffffffffffffe38);
    poVar2 = std::operator<<(poVar2,local_60);
    poVar2 = std::operator<<(poVar2,") actions ***");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"(c)ommand");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"(p)osition_sp  (");
    iVar1 = ev3dev::servo_motor::position_sp((servo_motor *)in_stack_fffffffffffffe30);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,")");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"(r)ate_sp      (");
    iVar1 = ev3dev::servo_motor::rate_sp((servo_motor *)in_stack_fffffffffffffe30);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,")");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"mi(n) pulse sp (");
    iVar1 = ev3dev::servo_motor::min_pulse_sp((servo_motor *)in_stack_fffffffffffffe30);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,")");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"mi(d) pulse sp (");
    iVar1 = ev3dev::servo_motor::mid_pulse_sp((servo_motor *)in_stack_fffffffffffffe30);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,")");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"ma(x) pulse sp (");
    iVar1 = ev3dev::servo_motor::max_pulse_sp((servo_motor *)in_stack_fffffffffffffe30);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,")");
    in_stack_fffffffffffffe38 =
         (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    in_stack_fffffffffffffe30 = std::operator<<(in_stack_fffffffffffffe38,"p(o)larity     [");
    ev3dev::servo_motor::polarity_abi_cxx11_((servo_motor *)in_stack_fffffffffffffe38);
    poVar4 = std::operator<<(in_stack_fffffffffffffe30,local_80);
    poVar5 = std::operator<<(poVar4,"]");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_60);
    poVar5 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"(b)ack");
    pvVar3 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar5,"Choice: ");
    std::operator>>((istream *)&std::cin,local_9);
    iVar1 = (int)((ulong)poVar4 >> 0x20);
    switch(local_9[0]) {
    case 'c':
      std::operator<<((ostream *)&std::cout,"command (run, float): ");
      std::operator>>((istream *)&std::cin,local_30);
      std::__cxx11::string::string(local_a0,local_30);
      ev3dev::servo_motor::set_command((servo_motor *)poVar2,(string *)in_stack_fffffffffffffe38);
      std::__cxx11::string::~string(local_a0);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      break;
    case 'd':
      std::operator<<((ostream *)&std::cout,"mid pulse sp: ");
      std::istream::operator>>((istream *)&std::cin,&local_10);
      ev3dev::servo_motor::set_mid_pulse_sp((servo_motor *)in_stack_fffffffffffffe30,iVar1);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      break;
    case 'n':
      std::operator<<((ostream *)&std::cout,"min pulse sp: ");
      std::istream::operator>>((istream *)&std::cin,&local_10);
      ev3dev::servo_motor::set_min_pulse_sp((servo_motor *)in_stack_fffffffffffffe30,iVar1);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      break;
    case 'o':
      std::operator<<((ostream *)&std::cout,"polarity (normal, inverted): ");
      std::operator>>((istream *)&std::cin,local_30);
      std::__cxx11::string::string(local_c0,local_30);
      ev3dev::servo_motor::set_polarity((servo_motor *)poVar2,(string *)in_stack_fffffffffffffe38);
      std::__cxx11::string::~string(local_c0);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      break;
    case 'p':
      std::operator<<((ostream *)&std::cout,"position sp: ");
      std::istream::operator>>((istream *)&std::cin,&local_10);
      ev3dev::servo_motor::set_position_sp((servo_motor *)in_stack_fffffffffffffe30,iVar1);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      break;
    case 'r':
      std::operator<<((ostream *)&std::cout,"rate sp: ");
      std::istream::operator>>((istream *)&std::cin,&local_10);
      ev3dev::servo_motor::set_rate_sp((servo_motor *)in_stack_fffffffffffffe30,iVar1);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      break;
    case 'x':
      std::operator<<((ostream *)&std::cout,"max pulse sp: ");
      std::istream::operator>>((istream *)&std::cin,&local_10);
      ev3dev::servo_motor::set_max_pulse_sp((servo_motor *)in_stack_fffffffffffffe30,iVar1);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
  } while (local_9[0] != 'b');
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void motor_action(servo_motor &m)
{
  char c = 0;
  int new_value = 0;
  std::string new_mode;

  do
  {
    cout << endl
         << "*** servo motor (" << m.address() << ") actions ***" << endl
         << endl
         << "(c)ommand" << endl
         << "(p)osition_sp  (" << m.position_sp()  << ")" << endl
         << "(r)ate_sp      (" << m.rate_sp()      << ")" << endl
         << "mi(n) pulse sp (" << m.min_pulse_sp() << ")" << endl
         << "mi(d) pulse sp (" << m.mid_pulse_sp() << ")" << endl
         << "ma(x) pulse sp (" << m.max_pulse_sp() << ")" << endl
         << "p(o)larity     [" << m.polarity()     << "]" << endl;
    cout << endl << "(b)ack" << endl
         << endl
         << "Choice: ";
    cin >> c;

    switch (c)
    {
    case 'c':
      cout << "command (run, float): ";
      cin >> new_mode; m.set_command(new_mode); cout << endl;
      break;
    case 'p':
      cout << "position sp: "; cin >> new_value; m.set_position_sp(new_value); cout << endl;
      break;
    case 'o':
      cout << "polarity (normal, inverted): ";
      cin >> new_mode; m.set_polarity(new_mode); cout << endl;
      break;
    case 'r':
      cout << "rate sp: "; cin >> new_value; m.set_rate_sp(new_value); cout << endl;
      break;
    case 'n':
      cout << "min pulse sp: "; cin >> new_value; m.set_min_pulse_sp(new_value); cout << endl;
      break;
    case 'd':
      cout << "mid pulse sp: "; cin >> new_value; m.set_mid_pulse_sp(new_value); cout << endl;
      break;
    case 'x':
      cout << "max pulse sp: "; cin >> new_value; m.set_max_pulse_sp(new_value); cout << endl;
      break;
    }
  }
  while (c != 'b');
}